

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiWindow_*>::push_front(ImVector<ImGuiWindow_*> *this,ImGuiWindow **v)

{
  ImVector<ImGuiWindow_*> *in_RSI;
  ImGuiWindow **in_RDI;
  ImVector<ImGuiWindow_*> *unaff_retaddr;
  
  if (*(int *)in_RDI == 0) {
    push_back(in_RSI,in_RDI);
  }
  else {
    insert(unaff_retaddr,in_RDI,(ImGuiWindow **)in_RSI);
  }
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }